

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

double __thiscall ON_NurbsSurface::ControlPolygonLength(ON_NurbsSurface *this,int dir)

{
  double *local_48;
  int local_34;
  int i;
  double *p;
  double length;
  double max_length;
  ON_NurbsSurface *pOStack_10;
  int dir_local;
  ON_NurbsSurface *this_local;
  
  length = 0.0;
  if ((((-1 < dir) && (dir < 2)) && (1 < this->m_cv_count[0])) &&
     ((1 < this->m_cv_count[1] && (this->m_cv != (double *)0x0)))) {
    max_length._4_4_ = dir;
    pOStack_10 = this;
    for (local_34 = 0; local_34 < this->m_cv_count[1 - max_length._4_4_]; local_34 = local_34 + 1) {
      p = (double *)0x0;
      if (max_length._4_4_ == 0) {
        local_48 = CV(this,0,local_34);
      }
      else {
        local_48 = CV(this,local_34,0);
      }
      ON_GetPolylineLength
                (this->m_dim,this->m_is_rat != 0,this->m_cv_count[max_length._4_4_],
                 this->m_cv_stride[max_length._4_4_],local_48,(double *)&p);
      if (length < (double)p) {
        length = (double)p;
      }
    }
  }
  return length;
}

Assistant:

double ON_NurbsSurface::ControlPolygonLength( int dir ) const
{
  double max_length = 0.0;
  if ( dir >= 0 && dir <= 1 && m_cv_count[0] >= 2 && m_cv_count[1] >= 2 && m_cv != nullptr )
  {
    double length;
    const double* p;
    int i;
    for( i = 0; i < m_cv_count[1-dir]; i++ )
    {
      length = 0.0;
      p = (dir) ? CV(i,0) : CV(0,i);
      ON_GetPolylineLength( m_dim, m_is_rat, m_cv_count[dir], m_cv_stride[dir], p, &length );
      if ( length > max_length )
        max_length = length;
    }
  }

  return max_length;
}